

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall wasm::OptimizeInstructions::inversesAnd(OptimizeInstructions *this,Binary *curr)

{
  bool bVar1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_88;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_40;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_18;
  
  local_40.submatchers.curr = &local_18;
  local_18.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
  local_40.submatchers.next.curr = &local_88;
  local_88.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.binder = (matched_t<wasm::Const_*> *)0x0;
  local_40.binder =
       (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *)
       0x0;
  local_88.submatchers.curr.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_88.submatchers.curr.submatchers.curr.data = 0;
  local_40.data = GeS;
  bVar1 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches(&local_40,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  return bVar1;
}

Assistant:

bool inversesAnd(Binary* curr) {
    using namespace Abstract;
    using namespace Match;

    // (x >= 0) & (y >= 0)   ==>   (x | y) >= 0
    if (matches(curr, binary(GeS, any(), ival(0)))) {
      return true;
    }

    return false;
  }